

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O2

int cmime_list_insert_next(CMimeList_T *list,CMimeListElem_T *elem,void *data)

{
  _CMimeListElem *p_Var1;
  _CMimeListElem *__ptr;
  int iVar2;
  _CMimeListElem **pp_Var3;
  
  __ptr = (_CMimeListElem *)calloc(1,0x18);
  if (list == (CMimeList_T *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                  ,0x84,"int cmime_list_insert_next(CMimeList_T *, CMimeListElem_T *, void *)");
  }
  if (__ptr == (_CMimeListElem *)0x0) {
    return -1;
  }
  iVar2 = list->size;
  if (elem == (CMimeListElem_T *)0x0) {
    if (iVar2 != 0) {
      free(__ptr);
      return -1;
    }
    __ptr->data = data;
  }
  else {
    __ptr->data = data;
    if (iVar2 != 0) {
      p_Var1 = elem->next;
      __ptr->next = p_Var1;
      pp_Var3 = &p_Var1->prev;
      if (p_Var1 == (_CMimeListElem *)0x0) {
        pp_Var3 = &list->tail;
      }
      __ptr->prev = elem;
      *pp_Var3 = __ptr;
      elem->next = __ptr;
      iVar2 = iVar2 + 1;
      goto LAB_0010668b;
    }
  }
  list->head = __ptr;
  list->tail = __ptr;
  iVar2 = 1;
LAB_0010668b:
  list->size = iVar2;
  return 0;
}

Assistant:

int cmime_list_insert_next(CMimeList_T *list, CMimeListElem_T *elem, void *data) {
    CMimeListElem_T *new = (CMimeListElem_T *)calloc(1,sizeof(CMimeListElem_T));
    
    assert(list);
        
    if(new == NULL) {
        return(-1);
    }
    
    /* no null element if list not empty */
    if(elem == NULL && cmime_list_size(list) != 0) {
        free(new);
        return(-1);
    }
 
    new->data = data;
 
    if(cmime_list_size(list) == 0) {
        list->head = new;
        list->tail = new;
        new->next = NULL;
        new->prev = NULL;
    } else {
        new->next = elem->next;
        new->prev = elem;

        if(elem->next == NULL) {
            list->tail = new;
        } else {
            elem->next->prev = new;
        }

        elem->next = new; 
    }
 
    list->size++;
 
    return(0);
}